

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.h
# Opt level: O1

byte_view __thiscall winmd::reader::file_view::open_file(file_view *this,string_view *path)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *extraout_RDX;
  byte_view bVar3;
  file_handle file;
  stat st;
  file_handle local_10c;
  string local_108;
  string local_e8;
  string local_c8;
  stat local_a8;
  
  if (path->_M_str[path->_M_len] != '\0') {
    std::terminate();
  }
  local_10c.value = open(path->_M_str,0,0);
  if (local_10c.value != -1) {
    iVar1 = fstat(local_10c.value,&local_a8);
    if (iVar1 < 0) {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"Could not open file \'","");
      impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2]>
                (&local_e8,path,(char (*) [2])0x1790c9);
    }
    if (local_a8.st_size == 0) {
      (this->super_byte_view).m_first = (uint8_t *)0x0;
      (this->super_byte_view).m_last = (uint8_t *)0x0;
    }
    else {
      puVar2 = (uint8_t *)mmap((void *)0x0,local_a8.st_size,1,0x8002,local_10c.value,0);
      if (puVar2 == (uint8_t *)0xffffffffffffffff) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Could not open file \'","");
        impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2]>
                  (&local_108,path,(char (*) [2])0x1790c9);
      }
      (this->super_byte_view).m_first = puVar2;
      (this->super_byte_view).m_last = puVar2 + local_a8.st_size;
    }
    file_handle::~file_handle(&local_10c);
    bVar3.m_last = extraout_RDX;
    bVar3.m_first = (uint8_t *)this;
    return bVar3;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Could not open file \'","");
  impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[2]>
            (&local_c8,path,(char (*) [2])0x1790c9);
}

Assistant:

static byte_view open_file(std::string_view const& path)
        {
#if defined(_WIN32)
            auto input = impl::c_str(path);

            auto const input_length = static_cast<uint32_t>(path.length() + 1);
            int buffer_length = MultiByteToWideChar(CP_UTF8, 0, input, input_length, 0, 0);
            std::vector<wchar_t> output = std::vector<wchar_t>(buffer_length);
            int result = MultiByteToWideChar(CP_UTF8, 0, input, input_length, output.data(), buffer_length);

            if (result == 0)
            {
                switch (GetLastError())
                {
                case ERROR_INSUFFICIENT_BUFFER:
                    impl::throw_invalid("Insufficient buffer size");
                case ERROR_NO_UNICODE_TRANSLATION:
                    impl::throw_invalid("Untranslatable path");
                default:
                    impl::throw_invalid("Could not convert path");
                }
            }

            file_handle file{ CreateFile2(output.data(), GENERIC_READ, FILE_SHARE_READ, OPEN_EXISTING, nullptr) };

            if (!file)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            LARGE_INTEGER size{};
            GetFileSizeEx(file.value, &size);

            if (!size.QuadPart)
            {
                return{};
            }

            handle mapping{ CreateFileMappingW(file.value, nullptr, PAGE_READONLY, 0, 0, nullptr) };

            if (!mapping)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            auto const first{ static_cast<uint8_t const*>(MapViewOfFile(mapping.value, FILE_MAP_READ, 0, 0, 0)) };
            return{ first, first + size.QuadPart };
#else
            file_handle file{ open(impl::c_str(path), O_RDONLY, 0) };
            if (!file)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            struct stat st;
            int ret = fstat(file.value, &st);
            if (ret < 0)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }
            if (!st.st_size)
            {
                return{};
            }
            
#if defined(__linux__)
            auto const flags = MAP_PRIVATE | MAP_POPULATE;
#else
            auto const flags = MAP_PRIVATE;
#endif
            
            auto const first = static_cast<uint8_t const*>(mmap(nullptr, st.st_size, PROT_READ, flags, file.value, 0));
            if (first == MAP_FAILED)
            {
                impl::throw_invalid("Could not open file '", path, "'");
            }

            return{ first, first + st.st_size };
#endif
        }